

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinNFA.cpp
# Opt level: O3

list<int,_std::allocator<int>_> * __thiscall
la::LevenshteinNFA::Move
          (list<int,_std::allocator<int>_> *__return_storage_ptr__,LevenshteinNFA *this,
          list<int,_std::allocator<int>_> *states,char inp)

{
  size_t *psVar1;
  byte bVar2;
  int iVar3;
  pointer pcVar4;
  byte bVar5;
  list<int,_std::allocator<int>_> *plVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  queue<int,_std::deque<int,_std::allocator<int>_>_> tmp;
  int local_9c;
  list<int,_std::allocator<int>_> *local_98;
  _List_node_base *local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  p_Var9 = (states->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  local_98 = __return_storage_ptr__;
  if (p_Var9 == (_List_node_base *)states) {
    bVar5 = 0;
  }
  else {
    uVar8 = this->_size;
    bVar5 = 0;
    uVar10 = uVar8;
    local_90 = (_List_node_base *)states;
    do {
      if (uVar10 == 0) {
        uVar10 = 0;
      }
      else {
        uVar12 = 0;
        do {
          lVar11 = (long)*(int *)&p_Var9[1]._M_next * uVar10;
          pcVar4 = (this->_transTable).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_transTable).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) <=
              lVar11 + uVar12) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          bVar2 = pcVar4[uVar12 + lVar11];
          if (bVar2 == inp || (bVar2 & 0xfd) == 0x7c) {
            p_Var7 = (_List_node_base *)operator_new(0x18);
            plVar6 = local_98;
            if ((inp & 0xfdU) != 0x7c) {
              bVar5 = bVar2 == inp | bVar5;
            }
            *(int *)&p_Var7[1]._M_next = (int)uVar12;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(plVar6->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            uVar8 = this->_size;
          }
          uVar12 = uVar12 + 1;
          uVar10 = uVar8;
        } while (uVar12 < uVar8);
      }
      p_Var9 = (((_List_base<int,_std::allocator<int>_> *)&p_Var9->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while (p_Var9 != local_90);
  }
  plVar6 = local_98;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar3 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_9c = 0;
      uVar8 = this->_size;
      if (uVar8 != 0) {
        uVar10 = 0;
        do {
          uVar10 = uVar8 * (long)iVar3 + uVar10;
          pcVar4 = (this->_transTable).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_transTable).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pcVar4) <= uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          if (pcVar4[uVar10] == '|') {
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_88,&local_9c);
            }
            else {
              *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_9c;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
            p_Var9 = (_List_node_base *)operator_new(0x18);
            *(int *)&p_Var9[1]._M_next = local_9c;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(plVar6->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            uVar8 = this->_size;
          }
          local_9c = local_9c + 1;
          uVar10 = (ulong)local_9c;
        } while (uVar10 < uVar8);
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (!(bool)((inp & 0xfdU) == 0x7c | bVar5)) {
    std::__cxx11::list<int,_std::allocator<int>_>::clear(plVar6);
  }
  std::__cxx11::list<int,_std::allocator<int>_>::sort(plVar6);
  std::__cxx11::list<int,_std::allocator<int>_>::unique(plVar6);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return plVar6;
}

Assistant:

std::list<int> LevenshteinNFA::Move(const std::list<int> &states, char inp) const
    {
        std::list<int> result;
        std::queue<int> tmp;
        bool needNormalLetter = false;
        bool findNormalLetter = false;
        if (inp != (char)LevenshteinNFA::Constants::Insertion &&
            inp != (char)LevenshteinNFA::Constants::Deletion)
            needNormalLetter = true;
        for (auto it = std::begin(states); it != std::end(states); ++it)
        {
            for (decltype(_size) j = 0; j < _size; j++)
            {
                char c = _transTable.at((*it * _size) + j);
                if (c == inp || c == (char)LevenshteinNFA::Constants::Insertion || c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    if (needNormalLetter && c == inp)
                        findNormalLetter = true;
                    result.push_back(j);
                }
            }
        }
        while (!tmp.empty())
        {
            int now = tmp.front();
            tmp.pop();
            for (int j = 0; j < _size; j++)
            {
                char c = _transTable.at((now * _size) + j);
                if (c == (char)LevenshteinNFA::Constants::Deletion)
                {
                    tmp.push(j);
                    result.push_back(j);
                }
            }
        }
        if (needNormalLetter && !findNormalLetter)
            result.clear();
        result.sort();
        result.unique();
        return result;
    }